

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::DecompressRle
               (uchar *dst,unsigned_long uncompressed_size,uchar *src,unsigned_long src_size)

{
  reference pvVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  value_type *pvVar2;
  long in_RSI;
  value_type *in_RDI;
  char *stop_1;
  char *s;
  char *t2;
  char *t1;
  int d;
  uchar *stop;
  uchar *t;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  size_type in_stack_ffffffffffffff38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  allocator_type *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  int maxLength;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  value_type *local_80;
  value_type *local_78;
  reference local_70;
  reference local_58;
  
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x168276);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
             ,in_stack_ffffffffffffff50);
  maxLength = (int)(in_stack_ffffffffffffff58 >> 0x20);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x16829c);
  rleUncompress(in_stack_ffffffffffffff60,maxLength,(char *)in_stack_ffffffffffffff50,
                in_stack_ffffffffffffff48);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                   (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  while (local_58 = pvVar1 + 1,
        local_58 <
        (reference)
        ((long)&(this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start + in_RSI)) {
    *local_58 = *pvVar1 + *local_58 + 0x80;
    pvVar1 = local_58;
  }
  local_70 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_80 = in_RDI;
  local_78 = pvVar1 + (in_RSI + 1U >> 1);
  while (local_80 < in_RDI + in_RSI) {
    pvVar2 = local_80 + 1;
    *local_80 = *local_70;
    if (in_RDI + in_RSI <= pvVar2) break;
    local_80 = local_80 + 2;
    *pvVar2 = *local_78;
    local_78 = local_78 + 1;
    local_70 = local_70 + 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  return;
}

Assistant:

static void DecompressRle(unsigned char *dst,
                          const unsigned long uncompressed_size,
                          const unsigned char *src, unsigned long src_size) {
  std::vector<unsigned char> tmpBuf(uncompressed_size);

  int ret = rleUncompress(static_cast<int>(src_size),
                          static_cast<int>(uncompressed_size),
                          reinterpret_cast<const signed char *>(src),
                          reinterpret_cast<char *>(dst));
  assert(ret == static_cast<int>(uncompressed_size));
  (void)ret;

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  // Predictor.
  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + uncompressed_size;

    while (t < stop) {
      int d = int(t[-1]) + int(t[0]) - 128;
      t[0] = static_cast<unsigned char>(d);
      ++t;
    }
  }

  // Reorder the pixel data.
  {
    const char *t1 = reinterpret_cast<const char *>(&tmpBuf.at(0));
    const char *t2 = reinterpret_cast<const char *>(&tmpBuf.at(0)) +
                     (uncompressed_size + 1) / 2;
    char *s = reinterpret_cast<char *>(dst);
    char *stop = s + uncompressed_size;

    for (;;) {
      if (s < stop)
        *(s++) = *(t1++);
      else
        break;

      if (s < stop)
        *(s++) = *(t2++);
      else
        break;
    }
  }
}